

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *this,
          VectorBlock<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1> *essential
          ,Scalar *tau,Scalar *workspace)

{
  Index IVar1;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *this_00;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>_>
  *other;
  MatrixBase<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>_>
  *this_01;
  Stride<0,_0> *in_RCX;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *in_RDI;
  Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false> bottom;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> tmp;
  Stride<0,_0> *in_stack_fffffffffffffc48;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffc60;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *in_stack_fffffffffffffc78;
  Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>
  *in_stack_fffffffffffffc80;
  Scalar *in_stack_fffffffffffffc88;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>
  *in_stack_fffffffffffffc90;
  CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>
  *in_stack_fffffffffffffd38;
  NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffd40;
  
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::rows
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>
                      *)0x2a1619);
  if (IVar1 == 1) {
    DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::operator*=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  else {
    this_00 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
              EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::cols
                        ((EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>
                          *)0x2a166a);
    Stride<0,_0>::Stride(in_RCX);
    Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>::Map
              (in_stack_fffffffffffffc60,(PointerArgType)this_00,(Index)in_RCX,
               in_stack_fffffffffffffc48);
    other = (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>_>
             *)EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::
               derived(in_RDI);
    IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::rows
                      ((EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>
                        *)0x2a16b4);
    this_01 = (MatrixBase<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>_>
               *)(IVar1 + -1);
    EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::cols
              ((EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               0x2a16c7);
    Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_-1,_-1,_false>::Block
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(Index)in_RDI,(Index)this_01,
               (Index)other,(Index)this_00);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_-1,_1,_false>_>
    ::adjoint((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
               *)in_stack_fffffffffffffc48);
    MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,-1,1,false>const>>
    ::operator*(this_01,other);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>::noalias
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffc48);
    NoAlias<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
               *)in_RCX,
              (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_6>_>
               *)in_stack_fffffffffffffc48);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::row
              (this_00,(Index)in_RCX);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_RDI,
               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
                *)this_01);
    Eigen::operator*((Scalar *)this_00,(StorageBaseType *)in_RCX);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::row
              (this_00,(Index)in_RCX);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>,1,-1,false>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
                *)in_RDI,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)this_01);
    Eigen::operator*((Scalar *)this_00,(StorageBaseType *)in_RCX);
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,-1,1,false>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>_>
                 *)this_01,
                (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>
                 *)other);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_-1,_-1,_false>_>
    ::noalias((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>_>
               *)in_stack_fffffffffffffc48);
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>,-1,-1,false>,Eigen::MatrixBase>
    ::operator-=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}